

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall QTableWidget::insertColumn(QTableWidget *this,int column)

{
  QTableModel *pQVar1;
  undefined4 in_ESI;
  long in_FS_OFFSET;
  QTableWidgetPrivate *d;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QTableWidget *)0x8dc409);
  pQVar1 = QTableWidgetPrivate::tableModel((QTableWidgetPrivate *)0x8dc418);
  QModelIndex::QModelIndex((QModelIndex *)0x8dc434);
  (**(code **)(*(long *)pQVar1 + 0x100))(pQVar1,in_ESI,1,local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidget::insertColumn(int column)
{
    Q_D(QTableWidget);
    d->tableModel()->insertColumns(column);
}